

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_timecondition(Curl_easy *data,Curl_send_buffer *req_buffer)

{
  int iVar1;
  size_t size;
  int local_ec;
  char *local_d0;
  char *condp;
  char datestr [80];
  undefined1 local_70 [4];
  CURLcode result;
  tm keeptime;
  tm *tm;
  Curl_send_buffer *req_buffer_local;
  Curl_easy *data_local;
  
  if ((data->set).timecondition == CURL_TIMECOND_NONE) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    tm = (tm *)req_buffer;
    req_buffer_local = (Curl_send_buffer *)data;
    datestr._76_4_ = Curl_gmtime((data->set).timevalue,(tm *)local_70);
    if (datestr._76_4_ == CURLE_OK) {
      keeptime.tm_zone = local_70;
      iVar1 = (int)req_buffer_local[0x6c].size_max;
      if (iVar1 == 1) {
        local_d0 = "If-Modified-Since";
      }
      else if (iVar1 == 2) {
        local_d0 = "If-Unmodified-Since";
      }
      else {
        if (iVar1 != 3) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        local_d0 = "Last-Modified";
      }
      if (keeptime.tm_mon == 0) {
        local_ec = 6;
      }
      else {
        local_ec = keeptime.tm_mon + -1;
      }
      curl_msnprintf((char *)&condp,0x50,"%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",local_d0,
                     Curl_wkday[local_ec],(ulong)(uint)keeptime.tm_min,Curl_month[keeptime.tm_hour],
                     keeptime.tm_mday + 0x76c,keeptime.tm_sec,result,local_70);
      size = strlen((char *)&condp);
      data_local._4_4_ = Curl_add_buffer((Curl_send_buffer **)&tm,&condp,size);
    }
    else {
      Curl_failf((Curl_easy *)req_buffer_local,"Invalid TIMEVALUE");
      data_local._4_1_ = datestr[0x4c];
      data_local._5_1_ = datestr[0x4d];
      data_local._6_1_ = datestr[0x4e];
      data_local._7_1_ = datestr[0x4f];
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_add_timecondition(struct Curl_easy *data,
                                Curl_send_buffer *req_buffer)
{
  const struct tm *tm;
  struct tm keeptime;
  CURLcode result;
  char datestr[80];
  const char *condp;

  if(data->set.timecondition == CURL_TIMECOND_NONE)
    /* no condition was asked for */
    return CURLE_OK;

  result = Curl_gmtime(data->set.timevalue, &keeptime);
  if(result) {
    failf(data, "Invalid TIMEVALUE");
    return result;
  }
  tm = &keeptime;

  switch(data->set.timecondition) {
  default:
    return CURLE_BAD_FUNCTION_ARGUMENT;

  case CURL_TIMECOND_IFMODSINCE:
    condp = "If-Modified-Since";
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    condp = "If-Unmodified-Since";
    break;
  case CURL_TIMECOND_LASTMOD:
    condp = "Last-Modified";
    break;
  }

  /* The If-Modified-Since header family should have their times set in
   * GMT as RFC2616 defines: "All HTTP date/time stamps MUST be
   * represented in Greenwich Mean Time (GMT), without exception. For the
   * purposes of HTTP, GMT is exactly equal to UTC (Coordinated Universal
   * Time)." (see page 20 of RFC2616).
   */

  /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
  msnprintf(datestr, sizeof(datestr),
            "%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
            condp,
            Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
            tm->tm_mday,
            Curl_month[tm->tm_mon],
            tm->tm_year + 1900,
            tm->tm_hour,
            tm->tm_min,
            tm->tm_sec);

  result = Curl_add_buffer(&req_buffer, datestr, strlen(datestr));

  return result;
}